

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int pigpio_command(int pi,int command,int p1,int p2,int rl)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  ssize_t sVar2;
  int cancelState;
  cmdCmd_t cmd;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_34 = -0x7db;
  if (((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) {
    local_34 = 0;
    local_40 = command;
    local_3c = p1;
    local_38 = p2;
    pthread_setcancelstate(1,&local_44);
    __mutex = gCmdMutex + (uint)pi;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    gCancelState[(uint)pi] = local_44;
    sVar2 = send(gPigCommand[(uint)pi],&local_40,0x10,0);
    if (sVar2 == 0x10) {
      sVar2 = recv(gPigCommand[(uint)pi],&local_40,0x10,0x100);
      if (sVar2 == 0x10) {
        if (rl != 0) {
          iVar1 = gCancelState[(uint)pi];
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          pthread_setcancelstate(iVar1,(int *)0x0);
        }
      }
      else {
        iVar1 = gCancelState[(uint)pi];
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_setcancelstate(iVar1,(int *)0x0);
        local_34 = -0x7d1;
      }
    }
    else {
      iVar1 = gCancelState[(uint)pi];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_setcancelstate(iVar1,(int *)0x0);
      local_34 = -2000;
    }
  }
  return local_34;
}

Assistant:

static int pigpio_command(int pi, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }

   if (rl) _pmu(pi);

   return cmd.res;
}